

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void init_proc_970(CPUPPCState_conflict2 *env)

{
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env_local;
  
  init_proc_book3s_common(env);
  gen_spr_sdr1(env);
  gen_spr_book3s_dbg(env);
  gen_spr_970_hid(env);
  gen_spr_970_hior(env);
  gen_low_BATs(env);
  gen_spr_970_pmu_sup(env);
  gen_spr_970_pmu_user(env);
  gen_spr_970_lpar(env);
  gen_spr_970_dbg(env);
  env->dcache_line_size = 0x80;
  env->icache_line_size = 0x80;
  init_excp_970(env);
  cpu = (PowerPCCPU_conflict3 *)env_archcpu((CPUArchState_conflict22 *)env);
  ppc970_irq_init(cpu);
  return;
}

Assistant:

static void init_proc_970(CPUPPCState *env)
{
    /* Common Registers */
    init_proc_book3s_common(env);
    gen_spr_sdr1(env);
    gen_spr_book3s_dbg(env);

    /* 970 Specific Registers */
    gen_spr_970_hid(env);
    gen_spr_970_hior(env);
    gen_low_BATs(env);
    gen_spr_970_pmu_sup(env);
    gen_spr_970_pmu_user(env);
    gen_spr_970_lpar(env);
    gen_spr_970_dbg(env);

    /* env variables */
    env->dcache_line_size = 128;
    env->icache_line_size = 128;

    /* Allocate hardware IRQ controller */
    init_excp_970(env);
    ppc970_irq_init(env_archcpu(env));
}